

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O3

bool iDynTree::exportLink(Link *link,string *linkName,Model *model,xmlNodePtr parent_element)

{
  long lVar1;
  bool bVar2;
  xmlNodePtr parent_element_00;
  SpatialInertia *inertia;
  long lVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"link",0);
  xmlNewProp(parent_element_00,"name",(linkName->_M_dataplus)._M_p);
  inertia = (SpatialInertia *)iDynTree::Link::getInertia();
  bVar2 = exportInertial(inertia,parent_element_00);
  lVar3 = iDynTree::Model::getLinkIndex((string *)model);
  iDynTree::Model::visualSolidShapes();
  plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
  if (*(long *)(*plVar4 + 8 + lVar3 * 0x18) != *(long *)(*plVar4 + lVar3 * 0x18)) {
    lVar1 = lVar3 * 0x18;
    uVar7 = 1;
    uVar8 = 0;
    do {
      uVar6 = uVar7;
      iDynTree::Model::visualSolidShapes();
      plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
      exportSolidShape(*(SolidShape **)(*(long *)(*plVar4 + lVar1) + uVar8 * 8),VISUAL,
                       parent_element_00);
      iDynTree::Model::visualSolidShapes();
      plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
      uVar7 = (ulong)((int)uVar6 + 1);
      uVar8 = uVar6;
    } while (uVar6 < (ulong)(*(long *)(*plVar4 + 8 + lVar1) - *(long *)(*plVar4 + lVar1) >> 3));
  }
  iDynTree::Model::collisionSolidShapes();
  plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
  if (*(long *)(*plVar4 + 8 + lVar3 * 0x18) != *(long *)(*plVar4 + lVar3 * 0x18)) {
    uVar5 = 1;
    uVar7 = 0;
    lVar3 = lVar3 * 0x18;
    do {
      iDynTree::Model::collisionSolidShapes();
      plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
      exportSolidShape(*(SolidShape **)(*(long *)(*plVar4 + lVar3) + uVar7 * 8),COLLISION,
                       parent_element_00);
      uVar7 = (ulong)uVar5;
      iDynTree::Model::collisionSolidShapes();
      plVar4 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
      uVar5 = uVar5 + 1;
    } while (uVar7 < (ulong)(*(long *)(*plVar4 + 8 + lVar3) - *(long *)(*plVar4 + lVar3) >> 3));
  }
  return bVar2;
}

Assistant:

bool exportLink(const Link &link, const std::string linkName, const Model& model, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST linkName.c_str());

    ok = ok && exportInertial(link.getInertia(), link_xml);

    LinkIndex linkIndex = model.getLinkIndex(linkName);

    // Export visual shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.visualSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        SolidShape * exportedShape = model.visualSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, VISUAL, link_xml);
    }

    // Export collision shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.collisionSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        // Clone the shape
        SolidShape * exportedShape = model.collisionSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, COLLISION, link_xml);
    }

    return ok;
}